

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedBodyInertia.cpp
# Opt level: O2

ArticulatedBodyInertia *
iDynTree::ArticulatedBodyInertia::ABADyadHelper
          (ArticulatedBodyInertia *__return_storage_ptr__,SpatialForceVector *U,double d)

{
  SpatialVector<iDynTree::SpatialForceVector> *pSVar1;
  AngularVector3T *pAVar2;
  double dVar3;
  ArticulatedBodyInertia *local_78 [2];
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>
  local_68;
  
  ArticulatedBodyInertia(__return_storage_ptr__);
  dVar3 = 1.0 / d;
  pSVar1 = &U->super_SpatialVector<iDynTree::SpatialForceVector>;
  pAVar2 = &(U->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3;
  local_78[0] = __return_storage_ptr__;
  local_68.m_lhs.m_lhs.m_functor.m_other = dVar3;
  local_68.m_lhs.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)pSVar1;
  local_68.m_rhs.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)pSVar1;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>>
            ((Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)local_78,
             &local_68);
  local_78[0] = (ArticulatedBodyInertia *)&__return_storage_ptr__->linearAngular;
  local_68.m_lhs.m_lhs.m_functor.m_other = dVar3;
  local_68.m_lhs.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)pSVar1;
  local_68.m_rhs.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)pAVar2;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>>
            ((Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)local_78,
             &local_68);
  local_78[0] = (ArticulatedBodyInertia *)&__return_storage_ptr__->angularAngular;
  local_68.m_lhs.m_lhs.m_functor.m_other = dVar3;
  local_68.m_lhs.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)pAVar2;
  local_68.m_rhs.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)pAVar2;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>>
            ((Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)local_78,
             &local_68);
  return __return_storage_ptr__;
}

Assistant:

ArticulatedBodyInertia ArticulatedBodyInertia::ABADyadHelper(const SpatialForceVector& U, const double d)
{
    ArticulatedBodyInertia ret;

    double inv_d = 1.0/d;

    Eigen::Map<const Eigen::Vector3d> Ulin(U.getLinearVec3().data());
    Eigen::Map<const Eigen::Vector3d> Uang(U.getAngularVec3().data());

    toEigen(ret.getLinearLinearSubmatrix()) = (inv_d*Ulin)*Ulin.transpose();
    toEigen(ret.getLinearAngularSubmatrix()) = (inv_d*Ulin)*Uang.transpose();
    toEigen(ret.getAngularAngularSubmatrix()) = (inv_d*Uang)*Uang.transpose();

    return ret;
}